

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rayfork.c
# Opt level: O2

_Bool rf_check_collision_ray_sphere(rf_ray ray,rf_vec3 center,float radius)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  
  fVar1 = center.x - ray.position.x;
  fVar2 = center.y - ray.position.y;
  fVar3 = center.z - ray.position.z;
  fVar4 = SQRT(fVar3 * fVar3 + fVar1 * fVar1 + fVar2 * fVar2);
  fVar1 = fVar3 * ray.direction.z + fVar1 * ray.direction.x + fVar2 * ray.direction.y;
  return 0.0 <= radius * radius - (fVar4 * fVar4 - fVar1 * fVar1);
}

Assistant:

RF_API bool rf_check_collision_ray_sphere(rf_ray ray, rf_vec3 center, float radius)
{
    bool collision = false;

    rf_vec3 ray_sphere_pos = rf_vec3_sub(center, ray.position);
    float distance = rf_vec3_len(ray_sphere_pos);
    float vector = rf_vec3_dot_product(ray_sphere_pos, ray.direction);
    float d = radius * radius - (distance * distance - vector * vector);

    if (d >= 0.0f) collision = true;

    return collision;
}